

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

bool __thiscall
ddd::DaTrie<true,_true,_false>::is_target_(DaTrie<true,_true,_false> *this,uint32_t base,Edge *edge)

{
  bool bVar1;
  byte *pbVar2;
  const_reference this_00;
  Edge *in_RDX;
  uint in_ESI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t child_pos;
  uint8_t label;
  uint8_t *__end2;
  uint8_t *__begin2;
  Edge *__range2;
  byte *local_30;
  
  local_30 = Edge::begin(in_RDX);
  pbVar2 = Edge::end(in_RDX);
  while( true ) {
    if (local_30 == pbVar2) {
      return true;
    }
    this_00 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                        (in_RDI,(ulong)(in_ESI ^ *local_30));
    bVar1 = Bc::is_fixed(this_00);
    if (bVar1) break;
    local_30 = local_30 + 1;
  }
  return false;
}

Assistant:

bool is_target_(uint32_t base, const Edge& edge) const {
    assert(0 < edge.size());

    for (auto label : edge) {
      auto child_pos = base ^label;
      if (bc_[child_pos].is_fixed()) {
        return false;
      }
    }
    return true;
  }